

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::lts_20250127::debugging_internal::ParseLocalNameSuffix(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  int number;
  ParseState copy;
  int local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar2 + 1;
  state->steps = iVar3 + 1;
  if (iVar3 < 0x20000 && iVar2 < 0x100) {
    pPVar1 = &state->parse_state;
    local_38._0_4_ = (state->parse_state).mangled_idx;
    local_38._4_4_ = (state->parse_state).out_cur_idx;
    uStack_30 = *(undefined8 *)&(state->parse_state).prev_name_idx;
    bVar4 = ParseOneCharToken(state,'d');
    if ((!bVar4) ||
       (state->mangled_begin[(state->parse_state).mangled_idx] != '_' &&
        9 < (byte)(state->mangled_begin[(state->parse_state).mangled_idx] - 0x30U))) {
      pPVar1->mangled_idx = (undefined4)local_38;
      pPVar1->out_cur_idx = local_38._4_4_;
      *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_30;
      MaybeAppend(state,"::");
      bVar4 = ParseName(state);
      if (bVar4) {
        ParseDiscriminator(state);
        bVar4 = true;
      }
      else {
        pPVar1->mangled_idx = (undefined4)local_38;
        pPVar1->out_cur_idx = local_38._4_4_;
        *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_30;
        if (*(int *)&(state->parse_state).field_0xc < 0) {
          state->out[(state->parse_state).out_cur_idx] = '\0';
        }
        bVar4 = ParseOneCharToken(state,'s');
        if (bVar4) {
          ParseDiscriminator(state);
        }
      }
      goto LAB_01071cc1;
    }
    local_3c = -1;
    ParseNumber(state,&local_3c);
    if (local_3c + 0x80000002U < 0x80000001) {
      local_3c = -1;
    }
    local_3c = local_3c + 2;
    MaybeAppend(state,"::{default arg#");
    MaybeAppendDecimal(state,local_3c);
    MaybeAppend(state,"}::");
    bVar4 = ParseOneCharToken(state,'_');
    if (bVar4) {
      bVar5 = ParseName(state);
      bVar4 = true;
      if (bVar5) goto LAB_01071cc1;
    }
    pPVar1->mangled_idx = (undefined4)local_38;
    pPVar1->out_cur_idx = local_38._4_4_;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_30;
    if (*(int *)&(state->parse_state).field_0xc < 0) {
      state->out[(state->parse_state).out_cur_idx] = '\0';
    }
  }
  bVar4 = false;
LAB_01071cc1:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar4;
}

Assistant:

static bool ParseLocalNameSuffix(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  // <local-name-suffix> ::= d [<(parameter) number>] _ <name>
  if (ParseOneCharToken(state, 'd') &&
      (IsDigit(RemainingInput(state)[0]) || RemainingInput(state)[0] == '_')) {
    int number = -1;
    Optional(ParseNumber(state, &number));
    if (number < -1 || number > 2147483645) {
      // Work around overflow cases.  We do not expect these outside of a fuzzer
      // or other source of adversarial input.  If we do detect overflow here,
      // we'll print {default arg#1}.
      number = -1;
    }
    number += 2;

    // The ::{default arg#1}:: infix must be rendered before the lambda itself,
    // so print this before parsing the rest of the <local-name-suffix>.
    MaybeAppend(state, "::{default arg#");
    MaybeAppendDecimal(state, number);
    MaybeAppend(state, "}::");
    if (ParseOneCharToken(state, '_') && ParseName(state)) return true;

    // On late parse failure, roll back not only the input but also the output,
    // whose trailing NUL was overwritten.
    state->parse_state = copy;
    if (state->parse_state.append) {
      state->out[state->parse_state.out_cur_idx] = '\0';
    }
    return false;
  }
  state->parse_state = copy;

  // <local-name-suffix> ::= <name> [<discriminator>]
  if (MaybeAppend(state, "::") && ParseName(state) &&
      Optional(ParseDiscriminator(state))) {
    return true;
  }
  state->parse_state = copy;
  if (state->parse_state.append) {
    state->out[state->parse_state.out_cur_idx] = '\0';
  }

  // <local-name-suffix> ::= s [<discriminator>]
  return ParseOneCharToken(state, 's') && Optional(ParseDiscriminator(state));
}